

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

Weight ON_Font::WeightFromWindowsLogfontWeight(int windows_logfont_weight)

{
  int iVar1;
  ulong uStack_38;
  int d;
  size_t i;
  int delta;
  Weight font_weight;
  size_t weight_count;
  Weight weights [9];
  int windows_logfont_weight_local;
  
  if ((windows_logfont_weight < 1) || (1000 < windows_logfont_weight)) {
    weights[8] = Normal;
  }
  else if (windows_logfont_weight < 0x96) {
    weights[8] = Thin;
  }
  else if (windows_logfont_weight < 0x352) {
    stack0xffffffffffffffe7 = 0x807060504030201;
    weights[0] = Heavy;
    i._7_1_ = Normal;
    weights._1_4_ = windows_logfont_weight;
    iVar1 = WindowsLogfontWeightFromWeight(Normal);
    i._0_4_ = iVar1 - weights._1_4_;
    if ((int)i < 1) {
      i._0_4_ = -(int)i;
    }
    for (uStack_38 = 0; (int)i != 0 && uStack_38 < 9; uStack_38 = uStack_38 + 1) {
      iVar1 = WindowsLogfontWeightFromWeight(*(Weight *)((long)&weight_count + uStack_38 + 7));
      iVar1 = iVar1 - weights._1_4_;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      if (iVar1 < (int)i) {
        i._7_1_ = *(Weight *)((long)&weight_count + uStack_38 + 7);
        i._0_4_ = iVar1;
      }
    }
    weights[8] = i._7_1_;
  }
  else {
    weights[8] = Heavy;
  }
  return weights[8];
}

Assistant:

ON_Font::Weight ON_Font::WeightFromWindowsLogfontWeight(
  int windows_logfont_weight
  )
{
  if ( windows_logfont_weight <= 0 || windows_logfont_weight > 1000 )
    return ON_Font::Weight::Normal;

  if ( windows_logfont_weight < 150 )
    return ON_Font::Weight::Thin;

  if ( windows_logfont_weight >= 850 )
    return ON_Font::Weight::Heavy;

  const ON_Font::Weight weights[] = 
  {
    ON_Font::Weight::Thin, // = 1
    ON_Font::Weight::Ultralight, // = 2
    ON_Font::Weight::Light, // = 3
    ON_Font::Weight::Normal, // = 4
    ON_Font::Weight::Medium, // = 5
    ON_Font::Weight::Semibold, // = 6
    ON_Font::Weight::Bold, // = 7
    ON_Font::Weight::Ultrabold, // = 8
    ON_Font::Weight::Heavy, // = 9
  };

  const size_t weight_count = sizeof(weights) / sizeof(weights[0]);
  ON_Font::Weight font_weight = ON_Font::Weight::Normal;
  int delta = std::abs(static_cast<int>(ON_Font::WindowsLogfontWeightFromWeight(font_weight)) - windows_logfont_weight);

  for (size_t i = 0; 0 != delta && i < weight_count; i++)
  {
    // look for a closer match
    int d = std::abs(static_cast<int>(ON_Font::WindowsLogfontWeightFromWeight(weights[i])) - windows_logfont_weight);
    if (d < delta)
    {
      font_weight = weights[i];
      delta = d;
    }
  }

  return font_weight;
}